

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::FormattingScene::Film
          (FormattingScene *this,string *type,ParsedParameterVector params,FileLoc loc)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  float *in_R8;
  string local_180;
  string local_160;
  vector<float,_std::allocator<float>_> s;
  vector<float,_std::allocator<float>_> m;
  float local_10c;
  string extra;
  ParameterDictionary dict;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_80;
  
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_80,in_RDX);
  ParameterDictionary::ParameterDictionary(&dict,&local_80,RGBColorSpace::sRGB);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_80);
  extra._M_dataplus._M_p = (pointer)&extra.field_2;
  extra._M_string_length = 0;
  extra.field_2._M_local_buf[0] = '\0';
  bVar1 = this->upgrade;
  if ((bool)bVar1 == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_180,"maxsampleluminance",(allocator<char> *)&local_160);
    ParameterDictionary::GetFloatArray(&m,&dict,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    if (m.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
        != m.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_finish) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_180,"maxsampleluminance",(allocator<char> *)&local_160);
      ParameterDictionary::RemoveFloat(&dict,&local_180);
      std::__cxx11::string::~string((string *)&local_180);
      indent_abi_cxx11_(&local_160,this,1);
      StringPrintf<std::__cxx11::string,float&>
                (&local_180,(pbrt *)"%s\"float maxcomponentvalue\" [ %f ]\n",(char *)&local_160,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 m.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                 ._M_start,in_R8);
      std::__cxx11::string::append((string *)&extra);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_160);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_180,"scale",(allocator<char> *)&local_160);
    ParameterDictionary::GetFloatArray(&s,&dict,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    if (s.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
        != s.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_finish) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_180,"scale",(allocator<char> *)&local_160);
      ParameterDictionary::RemoveFloat(&dict,&local_180);
      std::__cxx11::string::~string((string *)&local_180);
      indent_abi_cxx11_(&local_160,this,1);
      local_10c = *s.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start * 100.0;
      StringPrintf<std::__cxx11::string,float>
                (&local_180,(pbrt *)"%s\"float iso\" [ %f ]\n",(char *)&local_160,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_10c,
                 in_R8);
      std::__cxx11::string::append((string *)&extra);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_160);
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&s.super__Vector_base<float,_std::allocator<float>_>);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&m.super__Vector_base<float,_std::allocator<float>_>);
    bVar1 = this->upgrade;
  }
  if ((bVar1 & 1) != 0) {
    bVar2 = std::operator==(type,"image");
    if (bVar2) {
      indent_abi_cxx11_(&local_180,this,0);
      Printf<std::__cxx11::string>("%sFilm \"rgb\"\n",&local_180);
      goto LAB_0025f6a8;
    }
  }
  indent_abi_cxx11_(&local_180,this,0);
  Printf<std::__cxx11::string,std::__cxx11::string_const&>("%sFilm \"%s\"\n",&local_180,type);
LAB_0025f6a8:
  std::__cxx11::string::~string((string *)&local_180);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&extra);
  ParameterDictionary::ToParameterList_abi_cxx11_
            (&local_180,&dict,*(int *)&(this->super_SceneRepresentation).field_0xc);
  std::operator<<(poVar3,(string *)&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&extra);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&dict.params);
  return;
}

Assistant:

void FormattingScene::Film(const std::string &type, ParsedParameterVector params,
                           FileLoc loc) {
    ParameterDictionary dict(std::move(params), RGBColorSpace::sRGB);

    std::string extra;
    if (upgrade) {
        std::vector<Float> m = dict.GetFloatArray("maxsampleluminance");
        if (!m.empty()) {
            dict.RemoveFloat("maxsampleluminance");
            extra +=
                StringPrintf("%s\"float maxcomponentvalue\" [ %f ]\n", indent(1), m[0]);
        }
        std::vector<Float> s = dict.GetFloatArray("scale");
        if (!s.empty()) {
            dict.RemoveFloat("scale");
            extra += StringPrintf("%s\"float iso\" [ %f ]\n", indent(1), 100 * s[0]);
        }
    }

    if (upgrade && type == "image")
        Printf("%sFilm \"rgb\"\n", indent());
    else
        Printf("%sFilm \"%s\"\n", indent(), type);
    std::cout << extra << dict.ToParameterList(catIndentCount);
}